

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sam.c
# Opt level: O3

bam_pileup1_t * bam_plp_auto(bam_plp_t iter,int *_tid,int *_pos,int *_n_plp)

{
  int iVar1;
  bam_pileup1_t *pbVar2;
  
  if ((iter->func != (bam_plp_auto_f)0x0) && (iter->error == 0)) {
    pbVar2 = bam_plp_next(iter,_tid,_pos,_n_plp);
    if (pbVar2 != (bam_pileup1_t *)0x0) {
      return pbVar2;
    }
    *_n_plp = 0;
    if (iter->is_eof != 0) {
      return (bam_pileup1_t *)0x0;
    }
    while (iVar1 = (*iter->func)(iter->data,iter->b), -1 < iVar1) {
      iVar1 = bam_plp_push(iter,iter->b);
      if (iVar1 < 0) goto LAB_00118718;
      pbVar2 = bam_plp_next(iter,_tid,_pos,_n_plp);
      if (pbVar2 != (bam_pileup1_t *)0x0) {
        return pbVar2;
      }
    }
    if (iVar1 == -1) {
      if (iter->error == 0) {
        iter->is_eof = 1;
      }
      pbVar2 = bam_plp_next(iter,_tid,_pos,_n_plp);
      return pbVar2;
    }
    iter->error = iVar1;
  }
LAB_00118718:
  *_n_plp = -1;
  return (bam_pileup1_t *)0x0;
}

Assistant:

const bam_pileup1_t *bam_plp_auto(bam_plp_t iter, int *_tid, int *_pos, int *_n_plp)
{
    const bam_pileup1_t *plp;
    if (iter->func == 0 || iter->error) { *_n_plp = -1; return 0; }
    if ((plp = bam_plp_next(iter, _tid, _pos, _n_plp)) != 0) return plp;
    else { // no pileup line can be obtained; read alignments
        *_n_plp = 0;
        if (iter->is_eof) return 0;
        int ret;
        while ( (ret=iter->func(iter->data, iter->b)) >= 0) {
            if (bam_plp_push(iter, iter->b) < 0) {
                *_n_plp = -1;
                return 0;
            }
            if ((plp = bam_plp_next(iter, _tid, _pos, _n_plp)) != 0) return plp;
            // otherwise no pileup line can be returned; read the next alignment.
        }
        if ( ret < -1 ) { iter->error = ret; *_n_plp = -1; return 0; }
        bam_plp_push(iter, 0);
        if ((plp = bam_plp_next(iter, _tid, _pos, _n_plp)) != 0) return plp;
        return 0;
    }
}